

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

void __thiscall cmCTestGIT::CommitParser::ParsePerson(CommitParser *this,char *str,Person *person)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *__nptr;
  char *pcVar7;
  char *local_30;
  
  bVar2 = *str;
  while ((bVar2 != 0 && (iVar3 = isspace((uint)bVar2), iVar3 != 0))) {
    bVar2 = str[1];
    str = str + 1;
  }
  for (lVar5 = 0; (str[lVar5] != '\0' && (str[lVar5] != '<')); lVar5 = lVar5 + 1) {
  }
  __nptr = str + lVar5;
  lVar6 = lVar5;
  local_30 = __nptr;
  do {
    if (lVar6 == 0) break;
    iVar3 = isspace((uint)(byte)str[lVar6 + -1]);
    lVar6 = lVar6 + -1;
  } while (iVar3 != 0);
  std::__cxx11::string::_M_replace
            ((ulong)person,0,(char *)(person->Name)._M_string_length,(ulong)str);
  pcVar7 = __nptr;
  if (*__nptr != '\0') {
    __nptr = str + lVar5 + 1;
    pcVar7 = __nptr;
  }
  do {
    cVar1 = *__nptr;
    if (cVar1 == '\0') break;
    __nptr = __nptr + 1;
  } while (cVar1 != '>');
  local_30 = __nptr;
  std::__cxx11::string::_M_replace
            ((ulong)&person->EMail,0,(char *)(person->EMail)._M_string_length,(ulong)pcVar7);
  uVar4 = strtoul(__nptr,&local_30,10);
  person->Time = uVar4;
  lVar5 = strtol(local_30,&local_30,10);
  person->TimeZone = lVar5;
  return;
}

Assistant:

void ParsePerson(const char* str, Person& person)
  {
    // Person Name <person@domain.com> 1234567890 +0000
    const char* c = str;
    while (*c && cmIsSpace(*c)) {
      ++c;
    }

    const char* name_first = c;
    while (*c && *c != '<') {
      ++c;
    }
    const char* name_last = c;
    while (name_last != name_first && cmIsSpace(*(name_last - 1))) {
      --name_last;
    }
    person.Name.assign(name_first, name_last - name_first);

    const char* email_first = *c ? ++c : c;
    while (*c && *c != '>') {
      ++c;
    }
    const char* email_last = *c ? c++ : c;
    person.EMail.assign(email_first, email_last - email_first);

    person.Time = strtoul(c, const_cast<char**>(&c), 10);
    person.TimeZone = strtol(c, const_cast<char**>(&c), 10);
  }